

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

BoundingBox * __thiscall
draco::PointCloud::ComputeBoundingBox(BoundingBox *__return_storage_ptr__,PointCloud *this)

{
  float *pfVar1;
  float fVar2;
  int *piVar3;
  long lVar4;
  size_t __n;
  int i;
  int iVar5;
  long lVar6;
  ulong uVar7;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var8;
  Vector3f p;
  float local_38 [4];
  
  BoundingBox::BoundingBox(__return_storage_ptr__);
  piVar3 = this->named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)this->named_attribute_index_[0].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3) >> 2) < 1) {
    iVar5 = -1;
  }
  else {
    iVar5 = *piVar3;
  }
  if (iVar5 == -1) {
    _Var8._M_head_impl = (PointAttribute *)0x0;
  }
  else {
    _Var8._M_head_impl =
         *(PointAttribute **)
          &(this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
  }
  if ((_Head_base<0UL,_draco::PointAttribute_*,_false>)_Var8._M_head_impl !=
      (_Head_base<0UL,_draco::PointAttribute_*,_false>)0x0) {
    local_38[2] = 0.0;
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    if ((_Var8._M_head_impl)->num_unique_entries_ != 0) {
      lVar4 = **(long **)&(_Var8._M_head_impl)->super_GeometryAttribute;
      uVar7 = 0;
      do {
        __n = *(int64_t *)((long)&(_Var8._M_head_impl)->super_GeometryAttribute + 0x28);
        memcpy(local_38,(void *)(*(int64_t *)
                                  ((long)&(_Var8._M_head_impl)->super_GeometryAttribute + 0x30) +
                                 lVar4 + __n * uVar7),__n);
        lVar6 = 0;
        do {
          fVar2 = local_38[lVar6];
          if (fVar2 < (__return_storage_ptr__->min_point_).v_._M_elems[lVar6]) {
            (__return_storage_ptr__->min_point_).v_._M_elems[lVar6] = fVar2;
          }
          pfVar1 = (__return_storage_ptr__->max_point_).v_._M_elems + lVar6;
          if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
            (__return_storage_ptr__->max_point_).v_._M_elems[lVar6] = fVar2;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (_Var8._M_head_impl)->num_unique_entries_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundingBox PointCloud::ComputeBoundingBox() const {
  BoundingBox bounding_box;
  auto pc_att = GetNamedAttribute(GeometryAttribute::POSITION);
  if (pc_att == nullptr) {
    // Return default invalid bounding box.
    return bounding_box;
  }

  // TODO(b/199760503): Make the BoundingBox a template type, it may not be easy
  // because PointCloud is not a template.
  // Or simply add some preconditioning here to make sure the position attribute
  // is valid, because the current code works only if the position attribute is
  // defined with 3 components of DT_FLOAT32.
  // Consider using pc_att->ConvertValue<float, 3>(i, &p[0]) (Enforced
  // transformation from Vector with any dimension to Vector3f)
  Vector3f p;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(pc_att->size());
       ++i) {
    pc_att->GetValue(i, &p[0]);
    bounding_box.Update(p);
  }
  return bounding_box;
}